

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::find_wrap_range
          (Fl_Text_Display *this,char *deletedText,int pos,int nInserted,int nDeleted,
          int *modRangeStart,int *modRangeEnd,int *linesInserted,int *linesDeleted)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Fl_Text_Buffer *pFVar8;
  Fl_Text_Buffer *pFVar9;
  int local_94;
  int local_90;
  int nLines;
  int visLineNum;
  int i;
  int adjLineStart;
  int lineStart;
  int countTo;
  int countFrom;
  int *lineStarts;
  int nVisLines;
  Fl_Text_Buffer *buf;
  Fl_Text_Buffer *deletedTextBuf;
  int local_50;
  int retLineEnd;
  int retLineStart;
  int retLines;
  int retPos;
  int length;
  int *modRangeStart_local;
  int local_30;
  int nDeleted_local;
  int nInserted_local;
  int pos_local;
  char *deletedText_local;
  Fl_Text_Display *this_local;
  
  _retPos = modRangeStart;
  modRangeStart_local._4_4_ = nDeleted;
  local_30 = nInserted;
  nDeleted_local = pos;
  _nInserted_local = deletedText;
  deletedText_local = (char *)this;
  pFVar8 = buffer(this);
  iVar1 = this->mNVisibleLines;
  piVar2 = this->mLineStarts;
  local_90 = 0;
  local_94 = 0;
  if ((nDeleted_local < this->mFirstChar) || (nLines = iVar1, this->mLastChar < nDeleted_local)) {
    lineStart = Fl_Text_Buffer::line_start(pFVar8,nDeleted_local);
  }
  else {
    do {
      iVar4 = nLines;
      nLines = iVar4 + -1;
      if (nLines < 1) break;
    } while ((piVar2[nLines] == -1) || (nDeleted_local < piVar2[nLines]));
    if (nLines < 1) {
      lineStart = Fl_Text_Buffer::line_start(pFVar8,nDeleted_local);
    }
    else {
      lineStart = piVar2[iVar4 + -2];
      local_90 = iVar4 + -2;
    }
  }
  i = lineStart;
  *_retPos = lineStart;
  do {
    do {
      while( true ) {
        do {
          iVar4 = Fl_Text_Buffer::length(pFVar8);
          wrapped_line_counter
                    (this,pFVar8,i,iVar4,1,true,0,&retLineStart,&retLineEnd,&local_50,
                     (int *)((long)&deletedTextBuf + 4),true);
          iVar4 = retLineStart;
          iVar5 = Fl_Text_Buffer::length(pFVar8);
          iVar7 = retLineStart;
          if (iVar5 <= iVar4) {
            adjLineStart = Fl_Text_Buffer::length(pFVar8);
            *modRangeEnd = adjLineStart;
            if (retLineStart != deletedTextBuf._4_4_) {
              local_94 = local_94 + 1;
            }
            goto LAB_002233c7;
          }
          i = retLineStart;
          local_94 = local_94 + 1;
          if (nDeleted_local + local_30 < retLineStart) {
            iVar4 = Fl_Text_Buffer::prev_char(pFVar8,retLineStart);
            uVar6 = Fl_Text_Buffer::char_at(pFVar8,iVar4);
            if (uVar6 == 10) {
              adjLineStart = iVar7;
              *modRangeEnd = iVar7;
              goto LAB_002233c7;
            }
          }
          iVar4 = nDeleted_local;
        } while (this->mSuppressResync != 0);
        if (nDeleted_local < iVar7) break;
        while( true ) {
          bVar3 = false;
          if (local_90 < iVar1) {
            bVar3 = piVar2[local_90] < iVar7;
          }
          if (!bVar3) break;
          local_90 = local_90 + 1;
        }
        if ((local_90 < iVar1) && (piVar2[local_90] == iVar7)) {
          lineStart = iVar7;
          local_94 = 0;
          if ((local_90 + 1 < iVar1) && (piVar2[local_90 + 1] != -1)) {
            iVar7 = Fl_Text_Buffer::prev_char(pFVar8,piVar2[local_90 + 1]);
            iVar4 = min(iVar4,iVar7);
            *_retPos = iVar4;
          }
          else {
            *_retPos = iVar7;
          }
        }
        else {
          iVar4 = *_retPos;
          iVar7 = Fl_Text_Buffer::prev_char(pFVar8,iVar7);
          iVar4 = min(iVar4,iVar7);
          *_retPos = iVar4;
        }
      }
    } while (iVar7 <= nDeleted_local + local_30);
    iVar4 = (iVar7 - local_30) + modRangeStart_local._4_4_;
    while( true ) {
      bVar3 = false;
      if (local_90 < iVar1) {
        bVar3 = piVar2[local_90] < iVar4;
      }
      if (!bVar3) break;
      local_90 = local_90 + 1;
    }
  } while (((iVar1 <= local_90) || (piVar2[local_90] == -1)) || (piVar2[local_90] != iVar4));
  adjLineStart = line_end(this,iVar7,true);
  *modRangeEnd = iVar7;
LAB_002233c7:
  *linesInserted = local_94;
  if (this->mSuppressResync == 0) {
    retLines = (modRangeStart_local._4_4_ - lineStart) + (adjLineStart - local_30);
    pFVar8 = (Fl_Text_Buffer *)operator_new(0x88);
    Fl_Text_Buffer::Fl_Text_Buffer(pFVar8,retLines,0x400);
    pFVar9 = buffer(this);
    Fl_Text_Buffer::copy(pFVar8,(EVP_PKEY_CTX *)pFVar9,(EVP_PKEY_CTX *)(ulong)(uint)lineStart);
    if (modRangeStart_local._4_4_ != 0) {
      Fl_Text_Buffer::insert(pFVar8,nDeleted_local - lineStart,_nInserted_local);
    }
    pFVar9 = buffer(this);
    Fl_Text_Buffer::copy
              (pFVar8,(EVP_PKEY_CTX *)pFVar9,
               (EVP_PKEY_CTX *)(ulong)(uint)(nDeleted_local + local_30));
    wrapped_line_counter
              (this,pFVar8,0,retLines,0x7fffffff,true,lineStart,&retLineStart,&retLineEnd,&local_50,
               (int *)((long)&deletedTextBuf + 4),false);
    if (pFVar8 != (Fl_Text_Buffer *)0x0) {
      Fl_Text_Buffer::~Fl_Text_Buffer(pFVar8);
      operator_delete(pFVar8,0x88);
    }
    *linesDeleted = retLineEnd;
    this->mSuppressResync = 0;
  }
  else {
    *linesDeleted = this->mNLinesDeleted;
    this->mSuppressResync = 0;
  }
  return;
}

Assistant:

void Fl_Text_Display::find_wrap_range(const char *deletedText, int pos,
                                      int nInserted, int nDeleted,
                                      int *modRangeStart, int *modRangeEnd,
                                      int *linesInserted, int *linesDeleted) {
  IS_UTF8_ALIGNED(deletedText)
  IS_UTF8_ALIGNED2(buffer(), pos)

  int length, retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *deletedTextBuf, *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, countTo, lineStart, adjLineStart, i;
  int visLineNum = 0, nLines = 0;

  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--) {
      if (lineStarts[i] != -1 && pos >= lineStarts[i]) {
        break;
      }
    }
    if (i > 0) {
      countFrom = lineStarts[i-1];
      visLineNum = i-1;
    } else {
      countFrom = buf->line_start(pos);
    }
  } else {
    countFrom = buf->line_start(pos);
  }

  IS_UTF8_ALIGNED2(buf, countFrom)

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  *modRangeStart = countFrom;
  for (;;) {

    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      countTo = buf->length();
      *modRangeEnd = countTo;
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else {
      lineStart = retPos;
    }
    nLines++;
    if (lineStart > pos + nInserted && buf->char_at(buf->prev_char(lineStart)) == '\n') {
      countTo = lineStart;
      *modRangeEnd = lineStart;
      break;
    }

    /* Don't try to resync in continuous wrap mode with non-fixed font
     sizes; it would result in a chicken-and-egg dependency between
     the calculations for the inserted and the deleted lines.
     If we're in that mode, the number of deleted lines is calculated in
     advance, without resynchronization, so we shouldn't resynchronize
     for the inserted lines either. */
    if (mSuppressResync)
      continue;

    /* check for synchronization with the original line starts array
     before pos, if so, the modified range can begin later */
    if (lineStart <= pos) {
      while (visLineNum<nVisLines && lineStarts[visLineNum] < lineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] == lineStart) {
        countFrom = lineStart;
        nLines = 0;
        if (visLineNum+1 < nVisLines && lineStarts[visLineNum+1] != -1)
          *modRangeStart = min(pos, buf->prev_char(lineStarts[visLineNum+1]));
        else
          *modRangeStart = countFrom;
      } else
        *modRangeStart = min(*modRangeStart, buf->prev_char(lineStart));
    }

    /* check for synchronization with the original line starts array
     after pos, if so, the modified range can end early */
    else if (lineStart > pos + nInserted) {
      adjLineStart = lineStart - nInserted + nDeleted;
      while (visLineNum<nVisLines && lineStarts[visLineNum]<adjLineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] != -1 &&
          lineStarts[visLineNum] == adjLineStart) {
        countTo = line_end(lineStart, true);
        *modRangeEnd = lineStart;
        break;
      }
    }
  }
  *linesInserted = nLines;


  /* Count deleted lines between countFrom and countTo as the text existed
   before the modification (that is, as if the text between pos and
   pos+nInserted were replaced by "deletedText").  This extra context is
   necessary because wrapping can occur outside of the modified region
   as a result of adding or deleting text in the region. This is done by
   creating a textBuffer containing the deleted text and the necessary
   additional context, and calling the wrappedLineCounter on it.

   NOTE: This must not be done in continuous wrap mode when the font
   width is not fixed. In that case, the calculation would try
   to access style information that is no longer available (deleted
   text), or out of date (updated highlighting), possibly leading
   to completely wrong calculations and/or even crashes eventually.
   (This is not theoretical; it really happened.)

   In that case, the calculation of the number of deleted lines
   has happened before the buffer was modified (only in that case,
   because resynchronization of the line starts is impossible
   in that case, which makes the whole calculation less efficient).
   */
  if (mSuppressResync) {
    *linesDeleted = mNLinesDeleted;
    mSuppressResync = 0;
    return;
  }

  length = (pos-countFrom) + nDeleted +(countTo-(pos+nInserted));
  deletedTextBuf = new Fl_Text_Buffer(length);
  deletedTextBuf->copy(buffer(), countFrom, pos, 0);
  if (nDeleted != 0)
    deletedTextBuf->insert(pos-countFrom, deletedText);
  deletedTextBuf->copy(buffer(), pos+nInserted, countTo, pos-countFrom+nDeleted);
  /* Note that we need to take into account an offset for the style buffer:
   the deletedTextBuf can be out of sync with the style buffer. */
  wrapped_line_counter(deletedTextBuf, 0, length, INT_MAX, true, countFrom,
                       &retPos, &retLines, &retLineStart, &retLineEnd, false);
  delete deletedTextBuf;
  *linesDeleted = retLines;
  mSuppressResync = 0;
}